

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ForkJoin.cpp
# Opt level: O0

void __thiscall
amrex::ForkJoin::ForkJoin(ForkJoin *this,Vector<double,_std::allocator<double>_> *task_rank_pct)

{
  Vector<double,_std::allocator<double>_> *this_00;
  double *pdVar1;
  long lVar2;
  int *piVar3;
  ForkJoin *in_RDI;
  int cur;
  int i;
  double accum;
  int prev;
  Vector<int,_std::allocator<int>_> task_rank_n;
  Long ntasks;
  int rank_n;
  undefined4 in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  int local_5c;
  double local_58;
  int local_50;
  EVP_PKEY_CTX local_48 [24];
  Vector<double,_std::allocator<double>_> *local_30;
  int local_28;
  allocator local_11 [17];
  
  in_RDI->flag_verbose = false;
  in_RDI->flag_invoked = false;
  Vector<int,_std::allocator<int>_>::Vector((Vector<int,_std::allocator<int>_> *)0x12113e9);
  in_RDI->task_me = -1;
  std::
  map<amrex::BoxArray::RefID,_amrex::Vector<std::unique_ptr<amrex::DistributionMapping,_std::default_delete<amrex::DistributionMapping>_>,_std::allocator<std::unique_ptr<amrex::DistributionMapping,_std::default_delete<amrex::DistributionMapping>_>_>_>,_std::less<amrex::BoxArray::RefID>,_std::allocator<std::pair<const_amrex::BoxArray::RefID,_amrex::Vector<std::unique_ptr<amrex::DistributionMapping,_std::default_delete<amrex::DistributionMapping>_>,_std::allocator<std::unique_ptr<amrex::DistributionMapping,_std::default_delete<amrex::DistributionMapping>_>_>_>_>_>_>
  ::map((map<amrex::BoxArray::RefID,_amrex::Vector<std::unique_ptr<amrex::DistributionMapping,_std::default_delete<amrex::DistributionMapping>_>,_std::allocator<std::unique_ptr<amrex::DistributionMapping,_std::default_delete<amrex::DistributionMapping>_>_>_>,_std::less<amrex::BoxArray::RefID>,_std::allocator<std::pair<const_amrex::BoxArray::RefID,_amrex::Vector<std::unique_ptr<amrex::DistributionMapping,_std::default_delete<amrex::DistributionMapping>_>,_std::allocator<std::unique_ptr<amrex::DistributionMapping,_std::default_delete<amrex::DistributionMapping>_>_>_>_>_>_>
         *)0x1211403);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>_>_>_>
  ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>_>_>_>
                   *)0x1211416);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&in_RDI->task_output_dir,"",local_11);
  std::allocator<char>::~allocator((allocator<char> *)local_11);
  local_28 = ParallelContext::NProcsSub();
  this_00 = (Vector<double,_std::allocator<double>_> *)
            Vector<double,_std::allocator<double>_>::size
                      ((Vector<double,_std::allocator<double>_> *)0x1211476);
  local_30 = this_00;
  std::allocator<int>::allocator((allocator<int> *)0x1211494);
  Vector<int,_std::allocator<int>_>::vector
            ((Vector<int,_std::allocator<int>_> *)this_00,
             CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
             (allocator_type *)0x12114a8);
  std::allocator<int>::~allocator((allocator<int> *)0x12114b4);
  local_50 = 0;
  local_58 = 0.0;
  for (local_5c = 0; (long)local_5c < (long)local_30; local_5c = local_5c + 1) {
    pdVar1 = Vector<double,_std::allocator<double>_>::operator[]
                       (this_00,CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    local_58 = *pdVar1 + local_58;
    lVar2 = lround((double)local_28 * local_58);
    in_stack_ffffffffffffff5c = (int)lVar2 - local_50;
    piVar3 = Vector<int,_std::allocator<int>_>::operator[]
                       ((Vector<int,_std::allocator<int>_> *)this_00,
                        CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    *piVar3 = in_stack_ffffffffffffff5c;
    local_50 = (int)lVar2;
  }
  init(in_RDI,local_48);
  Vector<int,_std::allocator<int>_>::~Vector((Vector<int,_std::allocator<int>_> *)0x12115ab);
  return;
}

Assistant:

ForkJoin::ForkJoin (const Vector<double> &task_rank_pct)
{
    auto rank_n = ParallelContext::NProcsSub(); // number of ranks in current frame
    auto ntasks = task_rank_pct.size();
    Vector<int> task_rank_n(ntasks);
    int prev = 0;
    double accum = 0;
    for (int i = 0; i < ntasks; ++i) {
        accum += task_rank_pct[i];
        int cur = std::lround(rank_n * accum);
        task_rank_n[i] = cur - prev;
        prev = cur;
    }

    init(task_rank_n);
}